

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSymbol.cpp
# Opt level: O0

BOOL Js::JavascriptSymbol::Equals
               (JavascriptSymbol *left,Var right,BOOL *value,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  JavascriptSymbolObject *pJVar6;
  Var aValue;
  JavascriptSymbol *pJVar7;
  PropertyRecord *pPVar8;
  PropertyRecord *pPVar9;
  TypeId local_64;
  TypeId typeId;
  ScriptContext *requestContext_local;
  BOOL *value_local;
  Var right_local;
  JavascriptSymbol *left_local;
  TypeId local_34;
  TypeId local_28;
  TypeId typeId_1;
  TypeId typeId_2;
  
  if (right == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(right);
  if (bVar2) {
    local_28 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(right);
    if (bVar2) {
      local_28 = TypeIds_Number;
    }
    else {
      pRVar5 = UnsafeVarTo<Js::RecyclableObject>(right);
      if (pRVar5 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      local_28 = RecyclableObject::GetTypeId(pRVar5);
      if ((0x57 < (int)local_28) && (BVar3 = RecyclableObject::IsExternal(pRVar5), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
  }
  local_64 = local_28;
  value_local = (BOOL *)right;
  if ((local_28 != TypeIds_Symbol) && (local_28 != TypeIds_SymbolObject)) {
    value_local = (BOOL *)JavascriptConversion::ToPrimitive<(Js::JavascriptHint)0>
                                    (right,requestContext);
    if (value_local == (BOOL *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    bVar2 = TaggedInt::Is(value_local);
    if (bVar2) {
      local_34 = TypeIds_FirstNumberType;
    }
    else {
      bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(value_local);
      if (bVar2) {
        local_34 = TypeIds_Number;
      }
      else {
        pRVar5 = UnsafeVarTo<Js::RecyclableObject>(value_local);
        if (pRVar5 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        local_34 = RecyclableObject::GetTypeId(pRVar5);
        if ((0x57 < (int)local_34) && (BVar3 = RecyclableObject::IsExternal(pRVar5), BVar3 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
      }
    }
    local_64 = local_34;
  }
  if (local_64 == TypeIds_Symbol) {
    pJVar7 = UnsafeVarTo<Js::JavascriptSymbol>(value_local);
    *value = (uint)(left == pJVar7);
    pPVar8 = GetValue(left);
    pJVar7 = UnsafeVarTo<Js::JavascriptSymbol>(value_local);
    pPVar9 = GetValue(pJVar7);
    if ((uint)(pPVar8 == pPVar9) != *value) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSymbol.cpp"
                                  ,0x118,
                                  "((left->GetValue() == UnsafeVarTo<JavascriptSymbol>(right)->GetValue()) == *value)"
                                  ,
                                  "(left->GetValue() == UnsafeVarTo<JavascriptSymbol>(right)->GetValue()) == *value"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  else if (local_64 == TypeIds_SymbolObject) {
    pJVar6 = UnsafeVarTo<Js::JavascriptSymbolObject>(value_local);
    aValue = JavascriptSymbolObject::Unwrap(pJVar6);
    pJVar7 = UnsafeVarTo<Js::JavascriptSymbol>(aValue);
    *value = (uint)(left == pJVar7);
    pPVar8 = GetValue(left);
    pJVar6 = UnsafeVarTo<Js::JavascriptSymbolObject>(value_local);
    pPVar9 = JavascriptSymbolObject::GetValue(pJVar6);
    if ((uint)(pPVar8 == pPVar9) != *value) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSymbol.cpp"
                                  ,0x11c,
                                  "((left->GetValue() == UnsafeVarTo<JavascriptSymbolObject>(right)->GetValue()) == *value)"
                                  ,
                                  "(left->GetValue() == UnsafeVarTo<JavascriptSymbolObject>(right)->GetValue()) == *value"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  else {
    *value = 0;
  }
  return 1;
}

Assistant:

BOOL JavascriptSymbol::Equals(JavascriptSymbol* left, Var right, BOOL* value, ScriptContext * requestContext)
    {
        TypeId typeId = JavascriptOperators::GetTypeId(right);
        if (typeId != TypeIds_Symbol && typeId != TypeIds_SymbolObject)
        {
            right = JavascriptConversion::ToPrimitive<JavascriptHint::None>(right, requestContext);
            typeId = JavascriptOperators::GetTypeId(right);
        }

        switch (typeId)
        {
        case TypeIds_Symbol:
            *value = left == UnsafeVarTo<JavascriptSymbol>(right);
            Assert((left->GetValue() == UnsafeVarTo<JavascriptSymbol>(right)->GetValue()) == *value);
            break;
        case TypeIds_SymbolObject:
            *value = left == UnsafeVarTo<JavascriptSymbol>(UnsafeVarTo<JavascriptSymbolObject>(right)->Unwrap());
            Assert((left->GetValue() == UnsafeVarTo<JavascriptSymbolObject>(right)->GetValue()) == *value);
            break;
        default:
            *value = FALSE;
            break;
        }

        return TRUE;
    }